

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

uint Ga2_ObjComputeTruth_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int fFirst)

{
  uint uVar1;
  uint uVar2;
  
  if (fFirst == 0 && *(long *)pObj < 0) {
    uVar1 = pObj->Value;
  }
  else {
    uVar1 = (uint)*(long *)pObj;
    if (((int)uVar1 < 0) || (uVar1 = uVar1 & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                    ,0x91,"unsigned int Ga2_ObjComputeTruth_rec(Gia_Man_t *, Gia_Obj_t *, int)");
    }
    uVar1 = Ga2_ObjComputeTruth_rec(p,pObj + -(ulong)uVar1,0);
    uVar2 = Ga2_ObjComputeTruth_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),0);
    uVar1 = ((uint)((*(long *)pObj << 2) >> 0x3f) ^ uVar2) &
            ((int)*(long *)pObj * 4 >> 0x1f ^ uVar1);
  }
  return uVar1;
}

Assistant:

unsigned Ga2_ObjComputeTruth_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fFirst )
{
    unsigned Val0, Val1;
    if ( pObj->fPhase && !fFirst )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Val0 = Ga2_ObjComputeTruth_rec( p, Gia_ObjFanin0(pObj), 0 );
    Val1 = Ga2_ObjComputeTruth_rec( p, Gia_ObjFanin1(pObj), 0 );
    return (Gia_ObjFaninC0(pObj) ? ~Val0 : Val0) & (Gia_ObjFaninC1(pObj) ? ~Val1 : Val1);
}